

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O2

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _w;
  uint _h;
  uint _d;
  int *piVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int j;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  int k;
  long lVar20;
  long lVar21;
  int local_d0;
  
  iVar1 = bottom_blob->elempack;
  uVar16 = (ulong)iVar1;
  iVar11 = this->out_elempack;
  uVar18 = (ulong)iVar11;
  if (iVar1 == iVar11) {
LAB_0040432b:
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar1 = bottom_blob->w;
      iVar11 = bottom_blob->h;
      iVar15 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar1;
      top_blob->h = iVar11;
      top_blob->d = iVar15;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    goto switchD_004043dc_default;
  }
  _w = bottom_blob->w;
  lVar7 = (long)(int)_w;
  _h = bottom_blob->h;
  _d = bottom_blob->d;
  iVar15 = bottom_blob->c;
  iVar14 = bottom_blob->dims;
  uVar3 = bottom_blob->elemsize;
  if (this->use_padding == 0) {
    if (iVar14 == 2) {
      if ((int)(iVar1 * _h) % iVar11 == 0) goto LAB_0040487f;
    }
    else if (iVar14 == 1) {
      if ((int)(_w * iVar1) % iVar11 == 0) goto switchD_004043dc_caseD_1;
    }
    else if ((1 < iVar14 - 3U) || ((iVar15 * iVar1) % iVar11 == 0)) goto code_r0x004043ce;
    goto LAB_0040432b;
  }
code_r0x004043ce:
  switch(iVar14) {
  case 1:
switchD_004043dc_caseD_1:
    if (iVar11 == 1) {
      if (top_blob == bottom_blob) {
        iVar11 = 1;
      }
      else {
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->c = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        piVar2 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar2;
        top_blob->allocator = bottom_blob->allocator;
        top_blob->dims = bottom_blob->dims;
        iVar11 = bottom_blob->d;
        top_blob->h = bottom_blob->h;
        top_blob->d = iVar11;
        top_blob->c = bottom_blob->c;
        iVar11 = this->out_elempack;
      }
      top_blob->w = iVar1 * _w;
      top_blob->cstep = uVar16 * lVar7;
      top_blob->elemsize = uVar3 / uVar16;
      top_blob->elempack = iVar11;
      return 0;
    }
    Mat::create(top_blob,(int)(iVar1 * _w + iVar11 + -1) / iVar11,uVar18 * (uVar3 / uVar16),iVar11,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    memcpy(top_blob->data,bottom_blob->data,uVar3 * lVar7);
  default:
switchD_004043dc_default:
    local_d0 = 0;
    break;
  case 2:
LAB_0040487f:
    uVar19 = (long)(int)(iVar11 + iVar1 * _h + -1) / (long)iVar11;
    uVar8 = uVar19 & 0xffffffff;
    sVar17 = (uVar3 / uVar16) * uVar18;
    uVar18 = sVar17 / uVar18;
    iVar15 = (int)uVar19;
    Mat::create(top_blob,_w,iVar15,sVar17,iVar11,opt->blob_allocator);
    local_d0 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar16 = 0;
      if (0 < (int)_w) {
        uVar16 = (ulong)_w;
      }
      local_d0 = 0;
      if (iVar15 < 1) {
        uVar8 = 0;
      }
      for (uVar19 = 0; uVar19 != uVar8; uVar19 = uVar19 + 1) {
        pvVar6 = top_blob->data;
        for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
          for (lVar21 = 0; lVar21 < this->out_elempack; lVar21 = lVar21 + 1) {
            iVar11 = this->out_elempack * (int)uVar19 + (int)lVar21;
            iVar15 = iVar11 / iVar1;
            if ((int)_h <= iVar15) break;
            memcpy((void *)((long)pvVar6 +
                           uVar18 * lVar21 + sVar17 * uVar10 + sVar17 * lVar7 * uVar19),
                   (void *)((long)bottom_blob->data +
                           (long)(iVar11 % iVar1) * uVar18 + uVar3 * uVar10 +
                           (long)iVar15 * lVar7 * uVar3),uVar18);
          }
        }
      }
    }
    break;
  case 3:
    uVar19 = (long)(iVar1 * iVar15 + iVar11 + -1) / (long)iVar11;
    sVar17 = (uVar3 / uVar16) * uVar18;
    uVar18 = sVar17 / uVar18;
    iVar14 = (int)uVar19;
    Mat::create(top_blob,_w,_h,iVar14,sVar17,iVar11,opt->blob_allocator);
    local_d0 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar16 = 0;
      if (0 < (int)_w) {
        uVar16 = (ulong)_w;
      }
      uVar8 = (ulong)_h;
      if ((int)_h < 1) {
        uVar8 = 0;
      }
      local_d0 = 0;
      uVar19 = uVar19 & 0xffffffff;
      if (iVar14 < 1) {
        uVar19 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        pvVar6 = top_blob->data;
        for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
          for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
            for (lVar21 = 0; lVar21 < this->out_elempack; lVar21 = lVar21 + 1) {
              iVar11 = this->out_elempack * (int)uVar10 + (int)lVar21;
              iVar14 = iVar11 / iVar1;
              if (iVar15 <= iVar14) break;
              memcpy((void *)((long)pvVar6 +
                             uVar18 * lVar21 +
                             sVar17 * uVar12 + uVar9 * lVar7 * sVar17 + sVar4 * uVar10 * sVar5),
                     (void *)((long)bottom_blob->data +
                             (long)(iVar11 % iVar1) * uVar18 +
                             uVar3 * uVar12 + uVar9 * lVar7 * uVar3 +
                             (long)iVar14 * bottom_blob->cstep * bottom_blob->elemsize),uVar18);
            }
          }
        }
      }
    }
    break;
  case 4:
    uVar19 = (long)(iVar15 * iVar1 + iVar11 + -1) / (long)iVar11;
    uVar8 = uVar19 & 0xffffffff;
    sVar17 = (uVar3 / uVar16) * uVar18;
    uVar18 = sVar17 / uVar18;
    iVar14 = (int)uVar19;
    Mat::create(top_blob,_w,_h,_d,iVar14,sVar17,iVar11,opt->blob_allocator);
    local_d0 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar16 = 0;
      if (0 < (int)_w) {
        uVar16 = (ulong)_w;
      }
      uVar19 = 0;
      if (0 < (int)_h) {
        uVar19 = (ulong)_h;
      }
      if ((int)_d < 1) {
        _d = 0;
      }
      local_d0 = 0;
      if (iVar14 < 1) {
        uVar8 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        pvVar6 = top_blob->data;
        for (uVar9 = 0; uVar9 != _d; uVar9 = uVar9 + 1) {
          for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
            lVar21 = (uVar9 * (long)(int)_h + uVar12) * lVar7;
            for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
              for (lVar20 = 0; lVar20 < this->out_elempack; lVar20 = lVar20 + 1) {
                iVar11 = this->out_elempack * (int)uVar10 + (int)lVar20;
                iVar14 = iVar11 / iVar1;
                if (iVar15 <= iVar14) break;
                memcpy((void *)((long)pvVar6 +
                               uVar18 * lVar20 +
                               sVar17 * uVar13 + lVar21 * sVar17 + sVar4 * uVar10 * sVar5),
                       (void *)((long)bottom_blob->data +
                               (long)(iVar11 % iVar1) * uVar18 + uVar3 * uVar13 + lVar21 * uVar3 +
                               (long)iVar14 * bottom_blob->cstep * bottom_blob->elemsize),uVar18);
              }
            }
          }
        }
      }
    }
  }
  return local_d0;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = (size_t)w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + (size_t)i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + (size_t)srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + (size_t)i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + (size_t)i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    unsigned char* outptr = (unsigned char*)out + (size_t)(z * h + i) * w * out_elemsize;

                    for (int j = 0; j < w; j++)
                    {
                        unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                        for (int k = 0; k < out_elempack; k++)
                        {
                            int srcq = (q * out_elempack + k) / elempack;
                            if (srcq >= channels)
                                break;

                            int srck = (q * out_elempack + k) % elempack;

                            const Mat m = bottom_blob.channel(srcq);
                            const unsigned char* ptr = (const unsigned char*)m + (size_t)(z * h + i) * w * elemsize;
                            const unsigned char* elem_ptr = ptr + j * elemsize;

                            memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                        }
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}